

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

void icu_63::initAvailableLocaleList(UErrorCode *status)

{
  undefined1 auVar1 [16];
  UBool UVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  ulong *puVar4;
  char *size;
  UMemory *this;
  ulong uVar5;
  Locale *this_00;
  long lVar6;
  char *tempKey;
  UResourceBundle installed;
  Locale local_110;
  
  ures_initStackObject_63(&installed);
  resB = ures_openDirect_63("icudt63l-coll","res_index",status);
  size = "InstalledLocales";
  ures_getByKey_63(resB,"InstalledLocales",&installed,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar3 = ures_getSize_63(&installed);
    uVar5 = (ulong)iVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    this = (UMemory *)0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xe0),8) == 0) {
      this = (UMemory *)(SUB168(auVar1 * ZEXT816(0xe0),0) | 8);
    }
    ::availableLocaleListCount = iVar3;
    puVar4 = (ulong *)UMemory::operator_new__(this,(size_t)size);
    if (puVar4 == (ulong *)0x0) {
      ::availableLocaleList = (Locale *)0x0;
    }
    else {
      *puVar4 = uVar5;
      if (iVar3 != 0) {
        lVar6 = 0;
        this_00 = (Locale *)(puVar4 + 1);
        do {
          Locale::Locale(this_00);
          lVar6 = lVar6 + -0xe0;
          this_00 = this_00 + 1;
        } while (uVar5 * -0xe0 - lVar6 != 0);
      }
      ::availableLocaleList = (Locale *)(puVar4 + 1);
      ures_resetIterator_63(&installed);
      lVar6 = 0;
      while( true ) {
        UVar2 = ures_hasNext_63(&installed);
        if (UVar2 == '\0') break;
        tempKey = (char *)0x0;
        ures_getNextString_63(&installed,(int32_t *)0x0,&tempKey,status);
        Locale::Locale(&local_110,tempKey,(char *)0x0,(char *)0x0,(char *)0x0);
        Locale::operator=((Locale *)(::availableLocaleList->language + lVar6 + -8),&local_110);
        Locale::~Locale(&local_110);
        lVar6 = lVar6 + 0xe0;
      }
    }
    ures_close_63(&installed);
  }
  ures_close_63(resB);
  ucln_i18n_registerCleanup_63(UCLN_I18N_COLLATOR,collator_cleanup);
  return;
}

Assistant:

static void U_CALLCONV 
initAvailableLocaleList(UErrorCode &status) {
    U_ASSERT(availableLocaleListCount == 0);
    U_ASSERT(availableLocaleList == NULL);
    // for now, there is a hardcoded list, so just walk through that list and set it up.
    UResourceBundle *index = NULL;
    UResourceBundle installed;
    int32_t i = 0;
    
    ures_initStackObject(&installed);
    index = ures_openDirect(U_ICUDATA_COLL, "res_index", &status);
    ures_getByKey(index, "InstalledLocales", &installed, &status);
    
    if(U_SUCCESS(status)) {
        availableLocaleListCount = ures_getSize(&installed);
        availableLocaleList = new Locale[availableLocaleListCount];
        
        if (availableLocaleList != NULL) {
            ures_resetIterator(&installed);
            while(ures_hasNext(&installed)) {
                const char *tempKey = NULL;
                ures_getNextString(&installed, NULL, &tempKey, &status);
                availableLocaleList[i++] = Locale(tempKey);
            }
        }
        U_ASSERT(availableLocaleListCount == i);
        ures_close(&installed);
    }
    ures_close(index);
    ucln_i18n_registerCleanup(UCLN_I18N_COLLATOR, collator_cleanup);
}